

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O0

void __thiscall
Vertex::Vertex(Vertex *this,string *sequence,int pos,vector<int,_std::allocator<int>_> *qual,
              int number,int q,int tresh)

{
  allocator local_31;
  int local_30;
  int local_2c;
  int q_local;
  int number_local;
  vector<int,_std::allocator<int>_> *qual_local;
  string *psStack_18;
  int pos_local;
  string *sequence_local;
  Vertex *this_local;
  
  this->quality = 0;
  this->treshhold = 0;
  this->seq_number = 0;
  this->position = 0;
  local_30 = q;
  local_2c = number;
  _q_local = qual;
  qual_local._4_4_ = pos;
  psStack_18 = sequence;
  sequence_local = (string *)this;
  std::vector<int,_std::allocator<int>_>::vector(&this->qual_list);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->seq,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)&this->seq_del);
  this->compared_as_mutated = false;
  std::__cxx11::string::operator=((string *)&this->seq,(string *)sequence);
  std::__cxx11::string::operator=((string *)&this->seq_del,(string *)sequence);
  this->position = qual_local._4_4_;
  std::vector<int,_std::allocator<int>_>::operator=(&this->qual_list,qual);
  this->seq_number = local_2c;
  this->quality = local_30;
  this->treshhold = tresh;
  mutateVertex(this);
  return;
}

Assistant:

Vertex::Vertex(string sequence, int pos, vector<int> qual, int number, int q, int tresh){
    this->seq = sequence;
    this->seq_del = sequence;
    this->position = pos;
    this->qual_list = qual;
    this->seq_number = number;
    this->quality = q;
    this->treshhold = tresh;
    this->mutateVertex();

}